

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

size_t Q_GetPos(QMatrix *Q,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  size_t sVar2;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((RoC == 0) || (Q->Dim < RoC)) || (Q->Len[RoC] <= Entry)) {
      sVar2 = 0;
      LASError(LASRangeErr,"Q_GetPos",Q->Name,(char *)0x0,(char *)0x0);
    }
    else {
      sVar2 = Q->El[RoC][Entry].Pos;
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t Q_GetPos(QMatrix *Q, size_t RoC, size_t Entry)
/* returns the position of a matrix element */
{
    size_t Pos;

    if (LASResult() == LASOK)
        if (RoC > 0 && RoC <= Q->Dim && Entry < Q->Len[RoC]) {
            Pos = Q->El[RoC][Entry].Pos;
        } else {
            LASError(LASRangeErr, "Q_GetPos", Q->Name, NULL, NULL);
            Pos = 0;
        }
    else
        Pos = 0;
    return(Pos);
}